

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O3

void helicsEndpointSendStringAt
               (HelicsEndpoint endpoint,char *message,HelicsTime time,HelicsError *err)

{
  Endpoint *this;
  size_t data_size;
  Time sendTime;
  _Alloc_hider data;
  
  if (err == (HelicsError *)0x0) {
    if (endpoint == (HelicsEndpoint)0x0) {
      return;
    }
    if (*(int *)((long)endpoint + 0x20) != -0x4bac6b3e) {
      return;
    }
  }
  else {
    if (err->error_code != 0) {
      return;
    }
    if ((endpoint == (HelicsEndpoint)0x0) || (*(int *)((long)endpoint + 0x20) != -0x4bac6b3e)) {
      err->error_code = -3;
      err->message = "The given endpoint does not point to a valid object";
      return;
    }
  }
  this = *endpoint;
  data_size = gHelicsEmptyStr_abi_cxx11_._M_string_length;
  data._M_p = gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p;
  if (message != (char *)0x0) {
    data_size = strlen(message);
    data._M_p = message;
  }
  sendTime.internalTimeCode = 0x7fffffffffffffff;
  if (time <= -9223372036.854765) {
    sendTime.internalTimeCode = -0x7fffffffffffffff;
  }
  else if (time < 9223372036.854765) {
    sendTime.internalTimeCode =
         (baseType)
         (time * 1000000000.0 + *(double *)(&DAT_00429020 + (ulong)(0.0 <= time * 1000000000.0) * 8)
         );
  }
  helics::Endpoint::sendAt(this,data._M_p,data_size,sendTime);
  return;
}

Assistant:

void helicsEndpointSendStringAt(HelicsEndpoint endpoint, const char* message, HelicsTime time, HelicsError* err)
{
    auto* endObj = verifyEndpoint(endpoint, err);
    if (endObj == nullptr) {
        return;
    }
    try {
        endObj->endPtr->sendAt(AS_STRING_VIEW(message), time);
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}